

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O3

void JPCommonLabel_make(JPCommonLabel *label)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  JPCommonLabelBreathGroup *index;
  JPCommonLabelPhoneme *pJVar6;
  char **ppcVar7;
  void *pvVar8;
  undefined8 *__ptr;
  undefined8 *puVar9;
  _JPCommonLabelWord *p_Var10;
  _JPCommonLabelWord **pp_Var11;
  _JPCommonLabelBreathGroup *p_Var12;
  _JPCommonLabelAccentPhrase **pp_Var13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  JPCommonLabelBreathGroup *index_2;
  _JPCommonLabelPhoneme *p_Var17;
  ulong uVar18;
  _JPCommonLabelAccentPhrase *p_Var19;
  _JPCommonLabelWord *p_Var20;
  _JPCommonLabelMora *p_Var21;
  _JPCommonLabelAccentPhrase *p_Var22;
  JPCommonLabelBreathGroup *pJVar23;
  _JPCommonLabelAccentPhrase *p_Var24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  _JPCommonLabelBreathGroup *p_Var28;
  uint uVar29;
  JPCommonLabelAccentPhrase *index_3;
  JPCommonLabelAccentPhrase *pJVar30;
  JPCommonLabelMora *pJVar31;
  _JPCommonLabelMora *p_Var32;
  _JPCommonLabelWord *p_Var33;
  char *pcVar34;
  ulong uVar35;
  JPCommonLabelBreathGroup *index_1;
  ulong uVar36;
  size_t sVar37;
  size_t __nmemb;
  int iVar38;
  long lVar39;
  ulong uVar40;
  char buff [1024];
  
  pJVar6 = label->phoneme_head;
  label->size = 0;
  if (pJVar6 == (JPCommonLabelPhoneme *)0x0) {
    JPCommonLabel_make_cold_1();
    return;
  }
  __nmemb = 2;
  sVar2 = 6;
  do {
    sVar37 = sVar2;
    pJVar6 = pJVar6->next;
    __nmemb = __nmemb + 1;
    sVar2 = sVar37 + 1;
  } while (pJVar6 != (_JPCommonLabelPhoneme *)0x0);
  label->size = (int)__nmemb;
  ppcVar7 = (char **)calloc(__nmemb,8);
  label->feature = ppcVar7;
  lVar39 = 0;
  do {
    pvVar8 = calloc(0x400,1);
    *(void **)((long)label->feature + lVar39) = pvVar8;
    lVar39 = lVar39 + 8;
    __nmemb = __nmemb - 1;
  } while (__nmemb != 0);
  pJVar6 = label->phoneme_head;
  __ptr = (undefined8 *)calloc(sVar37 + 1,8);
  *__ptr = "xx";
  __ptr[1] = "xx";
  __ptr[2] = "sil";
  __ptr[sVar37 - 2] = "sil";
  __ptr[sVar37 - 1] = "xx";
  __ptr[sVar37] = "xx";
  if (pJVar6 != (JPCommonLabelPhoneme *)0x0) {
    puVar9 = __ptr + 3;
    p_Var17 = pJVar6;
    do {
      *puVar9 = p_Var17->phoneme;
      p_Var17 = p_Var17->next;
      puVar9 = puVar9 + 1;
    } while (p_Var17 != (_JPCommonLabelPhoneme *)0x0);
  }
  pcVar34 = "xx";
  uVar40 = 0;
  do {
    iVar4 = strcmp(pJVar6->phoneme,"pau");
    pcVar1 = (char *)__ptr[uVar40 + 1];
    sprintf(label->feature[uVar40],"%s^%s-%s+%s=%s",pcVar34,pcVar1,__ptr[uVar40 + 2],
            __ptr[uVar40 + 3],__ptr[uVar40 + 4]);
    if (((uVar40 == 0) || (iVar4 == 0)) || (uVar40 == label->size - 1)) {
      builtin_strncpy(buff,"/A:xx+xx+xx",0xb);
      buff._11_4_ = buff._11_4_ & 0xffffff00;
    }
    else {
      p_Var24 = ((_JPCommonLabelWord *)((_JPCommonLabelWord *)pJVar6->up)->tail)->up;
      p_Var20 = p_Var24->head;
      uVar5 = 0;
      p_Var10 = p_Var20;
      do {
        p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
        if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
        uVar5 = uVar5 + 1;
      } while (p_Var10 != (_JPCommonLabelWord *)pJVar6->up);
      iVar14 = p_Var24->accent;
      if (iVar14 == 0) {
        iVar14 = 0;
        p_Var10 = p_Var20;
        do {
          p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
          if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
          iVar14 = iVar14 + 1;
        } while (p_Var10 != (_JPCommonLabelWord *)p_Var24->tail->tail);
      }
      uVar25 = uVar5 - iVar14;
      if (0x30 < (int)uVar25) {
        uVar25 = 0x31;
      }
      uVar27 = (ulong)uVar25;
      if ((int)uVar25 < -0x30) {
        uVar27 = 0xffffffcf;
      }
      uVar25 = 0x31;
      if ((int)uVar5 < 0x31) {
        uVar25 = uVar5;
      }
      uVar18 = (ulong)uVar25;
      if ((int)uVar25 < 2) {
        uVar18 = 1;
      }
      do {
        p_Var20 = (_JPCommonLabelWord *)p_Var20->head;
        if (p_Var20 == (_JPCommonLabelWord *)0x0) break;
      } while (p_Var20 != (_JPCommonLabelWord *)p_Var24->tail->tail);
      sprintf(buff,"/A:%d+%d+%d",uVar27,uVar18);
    }
    strcat(label->feature[uVar40],buff);
    if (iVar4 == 0) {
      p_Var10 = pJVar6->prev->up->up;
      if (p_Var10 != (_JPCommonLabelWord *)0x0) goto LAB_00173e29;
LAB_00173e48:
      builtin_strncpy(buff,"/B:xx-xx_xx",0xb);
      buff._11_4_ = buff._11_4_ & 0xffffff00;
    }
    else {
      p_Var20 = pJVar6->up->up;
      p_Var10 = p_Var20->prev;
      if (p_Var10 == (_JPCommonLabelWord *)0x0) goto LAB_00173e48;
      if (uVar40 == label->size - 1) {
        p_Var10 = p_Var20;
      }
LAB_00173e29:
      sprintf(buff,"/B:%s-%s_%s",p_Var10->pos,p_Var10->ctype);
    }
    strcat(label->feature[uVar40],buff);
    if (((uVar40 == 0) || (iVar4 == 0)) || (uVar40 == label->size - 1)) {
      builtin_strncpy(buff,"/C:xx_xx+xx",0xb);
      buff._11_4_ = buff._11_4_ & 0xffffff00;
      strcat(label->feature[uVar40],buff);
      if (iVar4 != 0) goto LAB_00173ee5;
      p_Var10 = pJVar6->next->up->up;
LAB_00173f0b:
      if (p_Var10 == (_JPCommonLabelWord *)0x0) goto LAB_00173f2f;
      sprintf(buff,"/D:%s+%s_%s",p_Var10->pos,p_Var10->ctype);
    }
    else {
      p_Var10 = pJVar6->up->up;
      sprintf(buff,"/C:%s_%s+%s",p_Var10->pos,p_Var10->ctype);
      strcat(label->feature[uVar40],buff);
LAB_00173ee5:
      p_Var10 = pJVar6->up->up;
      p_Var20 = p_Var10->next;
      if (uVar40 != 0) {
        p_Var10 = p_Var20;
      }
      if (p_Var20 != (_JPCommonLabelWord *)0x0) goto LAB_00173f0b;
LAB_00173f2f:
      builtin_strncpy(buff,"/D:xx+xx_xx",0xb);
      buff._11_4_ = buff._11_4_ & 0xffffff00;
    }
    strcat(label->feature[uVar40],buff);
    if (iVar4 == 0) {
      pp_Var11 = &pJVar6->prev->up->up;
      lVar39 = 0x40;
LAB_00173f8d:
      pp_Var11 = (_JPCommonLabelWord **)((long)&(*pp_Var11)->pron + lVar39);
    }
    else {
      pp_Var11 = (_JPCommonLabelWord **)&pJVar6->up->up->up;
      lVar39 = 0x20;
      if (uVar40 != label->size - 1) goto LAB_00173f8d;
    }
    p_Var24 = (_JPCommonLabelAccentPhrase *)*pp_Var11;
    if (p_Var24 == (_JPCommonLabelAccentPhrase *)0x0) {
      builtin_strncpy(buff,"/E:xx_xx!xx_xx",0xf);
    }
    else {
      p_Var22 = p_Var24->head->head->up->up;
      p_Var10 = p_Var22->head;
      uVar5 = 0;
      p_Var20 = p_Var10;
      do {
        p_Var20 = (_JPCommonLabelWord *)p_Var20->head;
        if (p_Var20 == (_JPCommonLabelWord *)0x0) break;
        uVar5 = uVar5 + 1;
      } while (p_Var20 != (_JPCommonLabelWord *)p_Var22->tail->tail);
      if (0x30 < (int)uVar5) {
        uVar5 = 0x31;
      }
      if ((int)uVar5 < 2) {
        uVar5 = 1;
      }
      uVar25 = p_Var24->accent;
      if (uVar25 == 0) {
        uVar25 = 0;
        do {
          p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
          if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
          uVar25 = uVar25 + 1;
        } while (p_Var10 != (_JPCommonLabelWord *)p_Var22->tail->tail);
      }
      if (0x30 < (int)uVar25) {
        uVar25 = 0x31;
      }
      if ((int)uVar25 < 2) {
        uVar25 = 1;
      }
      sprintf(buff,"/E:%d_%d!%s_xx",(ulong)uVar5,(ulong)uVar25);
    }
    strcat(label->feature[uVar40],buff);
    if (uVar40 == 0) {
      builtin_strncpy(buff,"-xx",4);
      strcat(*label->feature,buff);
LAB_001742fc:
      builtin_strncpy(buff + 0x13,"x|xx_xx",8);
      builtin_strncpy(buff,"/F:xx_xx#xx_xx@xx_x",0x13);
    }
    else {
      if (((p_Var24 == (_JPCommonLabelAccentPhrase *)0x0) || (iVar4 == 0)) ||
         (uVar40 == label->size - 1)) {
        builtin_strncpy(buff,"-xx",4);
      }
      else {
        iVar14 = strcmp(p_Var24->tail->tail->tail->next->phoneme,"pau");
        sprintf(buff,"-%d",(ulong)(iVar14 != 0));
      }
      strcat(label->feature[uVar40],buff);
      if (((iVar4 == 0) || (uVar40 == label->size - 1)) ||
         (p_Var24 = pJVar6->up->up->up, p_Var24 == (_JPCommonLabelAccentPhrase *)0x0))
      goto LAB_001742fc;
      p_Var22 = p_Var24->up->head;
      uVar5 = 0;
      uVar25 = 0;
      if (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0) {
        p_Var19 = p_Var22;
        uVar26 = 1;
        do {
          uVar25 = uVar26;
          if (p_Var19 == p_Var24) break;
          p_Var19 = p_Var19->next;
          uVar26 = uVar25 + 1;
        } while (p_Var19 != (_JPCommonLabelAccentPhrase *)0x0);
      }
      p_Var10 = (_JPCommonLabelWord *)p_Var24->head->head;
      p_Var19 = ((_JPCommonLabelWord *)p_Var10->tail)->up;
      p_Var33 = p_Var19->up->head->head;
      p_Var20 = p_Var33;
      do {
        p_Var20 = (_JPCommonLabelWord *)p_Var20->head;
        if (p_Var20 == (_JPCommonLabelWord *)0x0) break;
        uVar5 = uVar5 + 1;
      } while (p_Var20 != p_Var10);
      p_Var10 = p_Var19->head;
      uVar26 = 0;
      p_Var20 = p_Var10;
      do {
        p_Var20 = (_JPCommonLabelWord *)p_Var20->head;
        if (p_Var20 == (_JPCommonLabelWord *)0x0) break;
        uVar26 = uVar26 + 1;
      } while (p_Var20 != (_JPCommonLabelWord *)p_Var19->tail->tail);
      if (0x30 < (int)uVar26) {
        uVar26 = 0x31;
      }
      if ((int)uVar26 < 2) {
        uVar26 = 1;
      }
      uVar15 = p_Var24->accent;
      if (uVar15 == 0) {
        uVar15 = 0;
        do {
          p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
          if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
          uVar15 = uVar15 + 1;
        } while (p_Var10 != (_JPCommonLabelWord *)p_Var19->tail->tail);
      }
      if (0x30 < (int)uVar15) {
        uVar15 = 0x31;
      }
      uVar27 = (ulong)uVar15;
      if ((int)uVar15 < 2) {
        uVar27 = 1;
      }
      pcVar34 = p_Var24->emotion;
      if (pcVar34 == (char *)0x0) {
        pcVar34 = "0";
      }
      uVar15 = 0x31;
      if ((int)uVar25 < 0x31) {
        uVar15 = uVar25;
      }
      if ((int)uVar15 < 2) {
        uVar15 = 1;
      }
      iVar38 = 0;
      iVar14 = 0;
      if (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0) {
        iVar3 = 1;
        do {
          iVar14 = iVar3;
          if (p_Var22 == p_Var24->up->tail) break;
          p_Var22 = p_Var22->next;
          iVar3 = iVar14 + 1;
        } while (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0);
      }
      iVar14 = iVar14 - uVar25;
      if (0x2f < iVar14) {
        iVar14 = 0x30;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      uVar25 = 99;
      if ((int)uVar5 < 99) {
        uVar25 = uVar5;
      }
      uVar18 = (ulong)uVar25;
      if ((int)uVar25 < 2) {
        uVar18 = 1;
      }
      do {
        p_Var33 = (_JPCommonLabelWord *)p_Var33->head;
        if (p_Var33 == (_JPCommonLabelWord *)0x0) break;
        iVar38 = iVar38 + 1;
      } while (p_Var33 != (_JPCommonLabelWord *)p_Var19->up->tail->tail->tail);
      iVar38 = iVar38 - uVar5;
      if (0x61 < iVar38) {
        iVar38 = 0x62;
      }
      if (iVar38 < 1) {
        iVar38 = 0;
      }
      sprintf(buff,"/F:%d_%d#%s_xx@%d_%d|%d_%d",(ulong)uVar26,uVar27,pcVar34,(ulong)uVar15,
              (ulong)(iVar14 + 1),uVar18,(ulong)(iVar38 + 1));
    }
    strcat(label->feature[uVar40],buff);
    if (iVar4 == 0) {
      pp_Var11 = &pJVar6->next->up->up;
      lVar39 = 0x40;
LAB_00174352:
      pp_Var11 = (_JPCommonLabelWord **)((long)&(*pp_Var11)->pron + lVar39);
    }
    else {
      pp_Var11 = (_JPCommonLabelWord **)&pJVar6->up->up->up;
      lVar39 = 0x28;
      if (uVar40 != 0) goto LAB_00174352;
    }
    p_Var24 = (_JPCommonLabelAccentPhrase *)*pp_Var11;
    if (p_Var24 == (_JPCommonLabelAccentPhrase *)0x0) {
      sprintf(buff,"/G:xx_xx%%xx_xx");
    }
    else {
      p_Var22 = p_Var24->head->head->up->up;
      p_Var10 = p_Var22->head;
      uVar5 = 0;
      p_Var20 = p_Var10;
      do {
        p_Var20 = (_JPCommonLabelWord *)p_Var20->head;
        if (p_Var20 == (_JPCommonLabelWord *)0x0) break;
        uVar5 = uVar5 + 1;
      } while (p_Var20 != (_JPCommonLabelWord *)p_Var22->tail->tail);
      if (0x30 < (int)uVar5) {
        uVar5 = 0x31;
      }
      if ((int)uVar5 < 2) {
        uVar5 = 1;
      }
      uVar25 = p_Var24->accent;
      if (uVar25 == 0) {
        uVar25 = 0;
        do {
          p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
          if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
          uVar25 = uVar25 + 1;
        } while (p_Var10 != (_JPCommonLabelWord *)p_Var22->tail->tail);
      }
      if (0x30 < (int)uVar25) {
        uVar25 = 0x31;
      }
      if ((int)uVar25 < 2) {
        uVar25 = 1;
      }
      sprintf(buff,"/G:%d_%d%%%s_xx",(ulong)uVar5,(ulong)uVar25);
    }
    strcat(label->feature[uVar40],buff);
    if (((uVar40 == 0) || (p_Var24 == (_JPCommonLabelAccentPhrase *)0x0)) ||
       ((iVar4 == 0 || (uVar40 == label->size - 1)))) {
      builtin_strncpy(buff,"_xx",4);
      strcat(label->feature[uVar40],buff);
      if (iVar4 != 0) goto LAB_001744b9;
      pp_Var13 = &pJVar6->prev->up->up->up;
      lVar39 = 0x30;
LAB_001744ee:
      pp_Var13 = (_JPCommonLabelAccentPhrase **)((long)&(*pp_Var13)->accent + lVar39);
    }
    else {
      iVar14 = strcmp(p_Var24->head->head->head->prev->phoneme,"pau");
      sprintf(buff,"_%d",(ulong)(iVar14 != 0));
      strcat(label->feature[uVar40],buff);
LAB_001744b9:
      pp_Var13 = (_JPCommonLabelAccentPhrase **)&pJVar6->up->up->up->up;
      lVar39 = 0x10;
      if (uVar40 != label->size - 1) goto LAB_001744ee;
    }
    if ((_JPCommonLabelBreathGroup *)*pp_Var13 == (_JPCommonLabelBreathGroup *)0x0) {
      builtin_strncpy(buff,"/H:xx_xx",9);
    }
    else {
      p_Var24 = ((_JPCommonLabelBreathGroup *)*pp_Var13)->head;
      p_Var28 = p_Var24->up;
      p_Var22 = p_Var28->head;
      if (p_Var22 == (_JPCommonLabelAccentPhrase *)0x0) {
        uVar27 = 1;
      }
      else {
        uVar5 = 1;
        do {
          uVar25 = uVar5;
          if (p_Var22 == p_Var28->tail) break;
          p_Var22 = p_Var22->next;
          uVar5 = uVar25 + 1;
        } while (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0);
        if (0x30 < (int)uVar25) {
          uVar25 = 0x31;
        }
        uVar27 = (ulong)uVar25;
      }
      p_Var28 = p_Var24->head->head->up->up->up;
      p_Var10 = p_Var28->head->head;
      uVar5 = 0;
      do {
        p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
        if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
        uVar5 = uVar5 + 1;
      } while (p_Var10 != (_JPCommonLabelWord *)p_Var28->tail->tail->tail);
      if (0x62 < (int)uVar5) {
        uVar5 = 99;
      }
      if ((int)uVar5 < 2) {
        uVar5 = 1;
      }
      sprintf(buff,"/H:%d_%d",uVar27,(ulong)uVar5);
    }
    strcat(label->feature[uVar40],buff);
    if (((uVar40 == 0) || (iVar4 == 0)) ||
       ((uVar40 == label->size - 1 ||
        (p_Var28 = pJVar6->up->up->up->up, p_Var28 == (_JPCommonLabelBreathGroup *)0x0)))) {
      builtin_strncpy(buff + 0x13,"x|xx+xx",8);
      builtin_strncpy(buff,"/I:xx-xx@xx+xx&xx-x",0x13);
    }
    else {
      p_Var12 = p_Var28;
      uVar5 = 0;
      do {
        uVar25 = uVar5;
        uVar5 = uVar25 + 1;
        p_Var12 = p_Var12->prev;
      } while (p_Var12 != (_JPCommonLabelBreathGroup *)0x0);
      p_Var24 = p_Var28->head;
      uVar26 = 0;
      uVar15 = 0;
      if (p_Var24 != (_JPCommonLabelAccentPhrase *)0x0) {
        uVar15 = 0;
        p_Var22 = p_Var24;
        do {
          uVar15 = uVar15 + 1;
          p_Var22 = p_Var22->prev;
        } while (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0);
      }
      p_Var32 = p_Var24->head->head;
      if (p_Var32 != (_JPCommonLabelMora *)0x0) {
        uVar26 = 0;
        p_Var21 = p_Var32;
        do {
          uVar26 = uVar26 + 1;
          p_Var21 = p_Var21->prev;
        } while (p_Var21 != (_JPCommonLabelMora *)0x0);
      }
      p_Var22 = p_Var24->up->head;
      if (p_Var22 == (_JPCommonLabelAccentPhrase *)0x0) {
        uVar27 = 1;
      }
      else {
        uVar16 = 1;
        do {
          uVar29 = uVar16;
          if (p_Var22 == p_Var24->up->tail) break;
          p_Var22 = p_Var22->next;
          uVar16 = uVar29 + 1;
        } while (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0);
        if (0x30 < (int)uVar29) {
          uVar29 = 0x31;
        }
        uVar27 = (ulong)uVar29;
      }
      p_Var12 = p_Var32->up->up->up;
      p_Var10 = p_Var12->head->head;
      uVar16 = 0;
      do {
        p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
        if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
        uVar16 = uVar16 + 1;
      } while (p_Var10 != (_JPCommonLabelWord *)p_Var12->tail->tail->tail);
      if (0x62 < (int)uVar16) {
        uVar16 = 99;
      }
      uVar18 = (ulong)uVar16;
      if ((int)uVar16 < 2) {
        uVar18 = 1;
      }
      p_Var12 = p_Var28;
      uVar25 = ~uVar25;
      do {
        uVar16 = uVar25;
        p_Var12 = p_Var12->next;
        uVar25 = uVar16 + 1;
      } while (p_Var12 != (_JPCommonLabelBreathGroup *)0x0);
      do {
        p_Var28 = p_Var28->prev;
        uVar16 = uVar16 + 1;
      } while (p_Var28 != (_JPCommonLabelBreathGroup *)0x0);
      if (0x11 < (int)uVar16) {
        uVar16 = 0x12;
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      uVar25 = 0x31;
      if ((int)uVar15 < 0x31) {
        uVar25 = uVar15;
      }
      uVar15 = ~uVar15;
      p_Var22 = p_Var24;
      do {
        p_Var22 = p_Var22->next;
        uVar15 = uVar15 + 1;
      } while (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0);
      uVar35 = (ulong)uVar5;
      if (0x12 < (int)uVar5) {
        uVar35 = 0x13;
      }
      uVar36 = (ulong)uVar25;
      if ((int)uVar25 < 2) {
        uVar36 = 1;
      }
      iVar14 = 0;
      for (; p_Var24 != (_JPCommonLabelAccentPhrase *)0x0; p_Var24 = p_Var24->prev) {
        iVar14 = iVar14 + 1;
      }
      iVar14 = iVar14 + uVar15;
      if (0x2f < iVar14) {
        iVar14 = 0x30;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      uVar5 = 199;
      if ((int)uVar26 < 199) {
        uVar5 = uVar26;
      }
      uVar26 = ~uVar26;
      p_Var21 = p_Var32;
      do {
        p_Var21 = p_Var21->next;
        uVar26 = uVar26 + 1;
      } while (p_Var21 != (_JPCommonLabelMora *)0x0);
      if ((int)uVar5 < 2) {
        uVar5 = 1;
      }
      iVar38 = 0;
      for (; p_Var32 != (_JPCommonLabelMora *)0x0; p_Var32 = p_Var32->prev) {
        iVar38 = iVar38 + 1;
      }
      iVar38 = iVar38 + uVar26;
      if (0xc5 < iVar38) {
        iVar38 = 0xc6;
      }
      if (iVar38 < 1) {
        iVar38 = 0;
      }
      sprintf(buff,"/I:%d-%d@%d+%d&%d-%d|%d+%d",uVar27,uVar18,uVar35,(ulong)(uVar16 + 1),uVar36,
              (ulong)(iVar14 + 1),(ulong)uVar5,(ulong)(iVar38 + 1));
    }
    strcat(label->feature[uVar40],buff);
    if (iVar4 == 0) {
      pp_Var13 = &pJVar6->next->up->up->up;
      lVar39 = 0x30;
LAB_001746e6:
      pp_Var13 = (_JPCommonLabelAccentPhrase **)((long)&(*pp_Var13)->accent + lVar39);
    }
    else {
      pp_Var13 = (_JPCommonLabelAccentPhrase **)&pJVar6->up->up->up->up;
      lVar39 = 0x18;
      if (uVar40 != 0) goto LAB_001746e6;
    }
    if ((_JPCommonLabelBreathGroup *)*pp_Var13 == (_JPCommonLabelBreathGroup *)0x0) {
      builtin_strncpy(buff,"/J:xx_xx",9);
    }
    else {
      p_Var24 = ((_JPCommonLabelBreathGroup *)*pp_Var13)->head;
      p_Var28 = p_Var24->up;
      p_Var22 = p_Var28->head;
      if (p_Var22 == (_JPCommonLabelAccentPhrase *)0x0) {
        uVar27 = 1;
      }
      else {
        uVar5 = 1;
        do {
          uVar25 = uVar5;
          if (p_Var22 == p_Var28->tail) break;
          p_Var22 = p_Var22->next;
          uVar5 = uVar25 + 1;
        } while (p_Var22 != (_JPCommonLabelAccentPhrase *)0x0);
        if (0x30 < (int)uVar25) {
          uVar25 = 0x31;
        }
        uVar27 = (ulong)uVar25;
      }
      p_Var28 = p_Var24->head->head->up->up->up;
      p_Var10 = p_Var28->head->head;
      uVar5 = 0;
      do {
        p_Var10 = (_JPCommonLabelWord *)p_Var10->head;
        if (p_Var10 == (_JPCommonLabelWord *)0x0) break;
        uVar5 = uVar5 + 1;
      } while (p_Var10 != (_JPCommonLabelWord *)p_Var28->tail->tail->tail);
      if (0x62 < (int)uVar5) {
        uVar5 = 99;
      }
      if ((int)uVar5 < 2) {
        uVar5 = 1;
      }
      sprintf(buff,"/J:%d_%d",uVar27,(ulong)uVar5);
    }
    uVar27 = uVar40 + 1;
    strcat(label->feature[uVar40],buff);
    pJVar23 = label->breath_head;
    iVar4 = -1;
    p_Var28 = pJVar23;
    do {
      p_Var28 = p_Var28->next;
      iVar4 = iVar4 + 1;
    } while (p_Var28 != (_JPCommonLabelBreathGroup *)0x0);
    iVar14 = 0;
    for (; pJVar23 != (JPCommonLabelBreathGroup *)0x0; pJVar23 = pJVar23->prev) {
      iVar14 = iVar14 + 1;
    }
    uVar5 = iVar14 + iVar4;
    if (0x12 < iVar14 + iVar4) {
      uVar5 = 0x13;
    }
    pJVar30 = label->accent_head;
    iVar4 = -1;
    p_Var24 = pJVar30;
    do {
      p_Var24 = p_Var24->next;
      iVar4 = iVar4 + 1;
    } while (p_Var24 != (_JPCommonLabelAccentPhrase *)0x0);
    if ((int)uVar5 < 2) {
      uVar5 = 1;
    }
    iVar14 = 0;
    for (; pJVar30 != (JPCommonLabelAccentPhrase *)0x0; pJVar30 = pJVar30->prev) {
      iVar14 = iVar14 + 1;
    }
    uVar25 = iVar14 + iVar4;
    if (0x30 < iVar14 + iVar4) {
      uVar25 = 0x31;
    }
    pJVar31 = label->mora_head;
    iVar4 = -1;
    p_Var32 = pJVar31;
    do {
      p_Var32 = p_Var32->next;
      iVar4 = iVar4 + 1;
    } while (p_Var32 != (_JPCommonLabelMora *)0x0);
    uVar18 = (ulong)uVar25;
    if ((int)uVar25 < 2) {
      uVar18 = 1;
    }
    iVar14 = 0;
    for (; pJVar31 != (JPCommonLabelMora *)0x0; pJVar31 = pJVar31->prev) {
      iVar14 = iVar14 + 1;
    }
    uVar25 = iVar14 + iVar4;
    if (0xc6 < (int)uVar25) {
      uVar25 = 199;
    }
    if ((int)uVar25 < 2) {
      uVar25 = 1;
    }
    sprintf(buff,"/K:%d+%d-%d",(ulong)uVar5,uVar18,(ulong)uVar25);
    strcat(label->feature[uVar40],buff);
    if ((uVar40 != 0) && ((long)uVar40 < (long)label->size + -2)) {
      pJVar6 = pJVar6->next;
    }
    pcVar34 = pcVar1;
    uVar40 = uVar27;
    if ((long)label->size <= (long)uVar27) {
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

void JPCommonLabel_make(JPCommonLabel * label)
{
   int i, tmp1, tmp2, tmp3;
   char buff[MAXBUFLEN];
   JPCommonLabelPhoneme *p;
   JPCommonLabelWord *w;
   JPCommonLabelAccentPhrase *a;
   JPCommonLabelBreathGroup *b;
   char **phoneme_list;
   int short_pause_flag;

   /* initialize */
   for (p = label->phoneme_head, label->size = 0; p != NULL; p = p->next)
      label->size++;
   if (label->size < 1) {
      fprintf(stderr, "WARNING: JPCommonLabel_make() in jcomon_label.c: No phoneme.\n");
      return;
   }
   label->size += 2;
   label->feature = (char **) calloc(label->size, sizeof(char *));
   for (i = 0; i < label->size; i++)
      label->feature[i] = (char *) calloc(MAXBUFLEN, sizeof(char));

   /* phoneme list */
   phoneme_list = (char **) calloc(label->size + 4, sizeof(char *));
   phoneme_list[0] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[1] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[2] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 1] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 2] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[label->size + 3] = JPCOMMON_PHONEME_UNKNOWN;
   for (i = 3, p = label->phoneme_head; p != NULL; p = p->next)
      phoneme_list[i++] = p->phoneme;

   for (i = 0, p = label->phoneme_head; i < label->size; i++) {
      if (strcmp(p->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0)
         short_pause_flag = 1;
      else
         short_pause_flag = 0;

      /* for phoneme */
      sprintf(label->feature[i], "%s^%s-%s+%s=%s", phoneme_list[i], phoneme_list[i + 1],
              phoneme_list[i + 2], phoneme_list[i + 3], phoneme_list[i + 4]);
      /* for A: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         sprintf(buff, "/A:xx+xx+xx");
      else {
         tmp1 = index_mora_in_accent_phrase(p->up);
         tmp2 =
             p->up->up->up->accent ==
             0 ? count_mora_in_accent_phrase(p->up) : p->up->up->up->accent;
         sprintf(buff, "/A:%d+%d+%d", limit(tmp1 - tmp2, -MAX_M, MAX_M), limit(tmp1, 1, MAX_M),
                 limit(count_mora_in_accent_phrase(p->up) - tmp1 + 1, 1, MAX_M));
      }
      strcat(label->feature[i], buff);
      /* for B: */
      if (short_pause_flag == 1)
         w = p->prev->up->up;
      else if (p->up->up->prev == NULL)
         w = NULL;
      else if (i == label->size - 1)
         w = p->up->up;
      else
         w = p->up->up->prev;
      if (w == NULL)
         sprintf(buff, "/B:xx-xx_xx");
      else
         sprintf(buff, "/B:%s-%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for C: */
      if (i == 0 || i == label->size - 1 || short_pause_flag)
         sprintf(buff, "/C:xx_xx+xx");
      else
         sprintf(buff, "/C:%s_%s+%s", p->up->up->pos, p->up->up->ctype, p->up->up->cform);
      strcat(label->feature[i], buff);
      /* for D: */
      if (short_pause_flag == 1)
         w = p->next->up->up;
      else if (p->up->up->next == NULL)
         w = NULL;
      else if (i == 0)
         w = p->up->up;
      else
         w = p->up->up->next;
      if (w == NULL)
         sprintf(buff, "/D:xx+xx_xx");
      else
         sprintf(buff, "/D:%s+%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for E: */
      if (short_pause_flag == 1)
         a = p->prev->up->up->up;
      else if (i == label->size - 1)
         a = p->up->up->up;
      else
         a = p->up->up->up->prev;
      if (a == NULL)
         sprintf(buff, "/E:xx_xx!xx_xx");
      else
         sprintf(buff, "/E:%d_%d!%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "-xx");
      else
         sprintf(buff, "-%d",
                 strcmp(a->tail->tail->tail->next->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for F: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         a = NULL;
      else
         a = p->up->up->up;
      if (a == NULL)
         sprintf(buff, "/F:xx_xx#xx_xx@xx_xx|xx_xx");
      else {
         tmp1 = index_accent_phrase_in_breath_group(a);
         tmp2 = index_mora_in_breath_group(a->head->head);
         sprintf(buff, "/F:%d_%d#%s_xx@%d_%d|%d_%d",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion, limit(tmp1, 1, MAX_M),
                 limit(count_accent_phrase_in_breath_group(a) - tmp1 + 1, 1, MAX_M), limit(tmp2, 1,
                                                                                           MAX_L),
                 limit(count_mora_in_breath_group(a->head->head) - tmp2 + 1, 1, MAX_L));
      }
      strcat(label->feature[i], buff);
      /* for G: */
      if (short_pause_flag == 1)
         a = p->next->up->up->up;
      else if (i == 0)
         a = p->up->up->up;
      else
         a = p->up->up->up->next;
      if (a == NULL)
         sprintf(buff, "/G:xx_xx%%xx_xx");
      else
         sprintf(buff, "/G:%d_%d%%%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "_xx");
      else
         sprintf(buff, "_%d",
                 strcmp(a->head->head->head->prev->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for H: */
      if (short_pause_flag == 1)
         b = p->prev->up->up->up->up;
      else if (i == label->size - 1)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->prev;
      if (b == NULL)
         sprintf(buff, "/H:xx_xx");
      else
         sprintf(buff, "/H:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for I: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         b = NULL;
      else
         b = p->up->up->up->up;
      if (b == NULL)
         sprintf(buff, "/I:xx-xx@xx+xx&xx-xx|xx+xx");
      else {
         tmp1 = index_breath_group_in_utterance(b);
         tmp2 = index_accent_phrase_in_utterance(b->head);
         tmp3 = index_mora_in_utterance(b->head->head->head);
         sprintf(buff, "/I:%d-%d@%d+%d&%d-%d|%d+%d",
                 limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L), limit(tmp1, 1,
                                                                                         MAX_S),
                 limit(count_breath_group_in_utterance(b) - tmp1 + 1, 1, MAX_S), limit(tmp2, 1,
                                                                                       MAX_M),
                 limit(count_accent_phrase_in_utterance(b->head) - tmp2 + 1, 1, MAX_M), limit(tmp3,
                                                                                              1,
                                                                                              MAX_LL),
                 limit(count_mora_in_utterance(b->head->head->head) - tmp3 + 1, 1, MAX_LL));
      }
      strcat(label->feature[i], buff);
      /* for J: */
      if (short_pause_flag == 1)
         b = p->next->up->up->up->up;
      else if (i == 0)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->next;
      if (b == NULL)
         sprintf(buff, "/J:xx_xx");
      else
         sprintf(buff, "/J:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for K: */
      sprintf(buff, "/K:%d+%d-%d",
              limit(count_breath_group_in_utterance(label->breath_head), 1, MAX_S),
              limit(count_accent_phrase_in_utterance(label->accent_head), 1, MAX_M),
              limit(count_mora_in_utterance(label->mora_head), 1, MAX_LL));
      strcat(label->feature[i], buff);

      if (0 < i && i < label->size - 2)
         p = p->next;
   }

   /* free */
   free(phoneme_list);
}